

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

Uint64 __thiscall Diligent::FenceVkImpl::InternalGetCompletedValue(FenceVkImpl *this)

{
  bool bVar1;
  VkResult VVar2;
  Char *Message;
  VulkanLogicalDevice *this_00;
  reference pvVar3;
  element_type *this_01;
  VkFence fence;
  char (*in_RCX) [23];
  VkResult status;
  SyncPointData *Item;
  VulkanLogicalDevice *LogicalDevice;
  undefined1 local_48 [8];
  string msg;
  FenceVkImpl *this_local;
  memory_order __b;
  
  msg.field_2._8_8_ = this;
  bVar1 = IsTimelineSemaphore(this);
  if (bVar1) {
    FormatString<char[26],char[23]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!IsTimelineSemaphore()",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"InternalGetCompletedValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x81);
    std::__cxx11::string::~string((string *)local_48);
  }
  this_00 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                       .m_pDevice);
  while (bVar1 = std::
                 deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ::empty(&this->m_SyncPoints), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::
             deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
             ::front(&this->m_SyncPoints);
    this_01 = std::
              __shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pvVar3->SyncPoint);
    fence = SyncPointVk::GetFence(this_01);
    VVar2 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus(this_00,fence);
    if (VVar2 != VK_SUCCESS) break;
    FenceBase<Diligent::EngineVkImplTraits>::UpdateLastCompletedFenceValue
              (&this->super_FenceBase<Diligent::EngineVkImplTraits>,pvVar3->Value);
    std::
    deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
    ::pop_front(&this->m_SyncPoints);
  }
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceVkImpl::InternalGetCompletedValue()
{
    VERIFY_EXPR(!IsTimelineSemaphore());

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    while (!m_SyncPoints.empty())
    {
        SyncPointData& Item = m_SyncPoints.front();

        VkResult status = LogicalDevice.GetFenceStatus(Item.SyncPoint->GetFence());
        if (status == VK_SUCCESS)
        {
            UpdateLastCompletedFenceValue(Item.Value);
            m_SyncPoints.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}